

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O0

void flux_test::getTarget(void)

{
  SystemImpl *this;
  FlowExp *this_00;
  SystemImpl *pSVar1;
  FlowExp *flux;
  SystemImpl *s1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(this_00);
  (**(code **)(*(long *)this_00 + 8))(this_00,this);
  pSVar1 = (SystemImpl *)(**(code **)(*(long *)this_00 + 0x10))();
  if (pSVar1 == this) {
    return;
  }
  __assert_fail("flux->getTarget() == s1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/flux_test.cpp"
                ,0x1c,"static void flux_test::getTarget()");
}

Assistant:

void flux_test::getTarget() {
    auto *s1 = new SystemImpl();
    auto *flux = new FlowExp();
    flux->setTarget(s1);
    assert(flux->getTarget() == s1);
}